

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall
pbrt::BinaryReader::read<pbrt::Texture>(BinaryReader *this,shared_ptr<pbrt::Texture> *t)

{
  undefined8 in_RSI;
  int ID_00;
  BinaryReader *in_RDI;
  int32_t ID;
  shared_ptr<pbrt::Texture> *in_stack_ffffffffffffffc8;
  BinaryReader *this_00;
  
  ID_00 = (int)((ulong)in_RSI >> 0x20);
  this_00 = in_RDI;
  read<int,void>(in_RDI,(int *)in_stack_ffffffffffffffc8);
  getEntity<pbrt::Texture>(this_00,ID_00);
  std::shared_ptr<pbrt::Texture>::operator=
            ((shared_ptr<pbrt::Texture> *)in_RDI,in_stack_ffffffffffffffc8);
  std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x12711e);
  return;
}

Assistant:

inline void read(std::shared_ptr<T> &t)
    {
      int32_t ID;
      read(ID);
      t = getEntity<T>(ID);
    }